

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

DualMap * __thiscall bloaty::DualMaps::AppendMap(DualMaps *this)

{
  DualMap *this_00;
  DualMap *local_18;
  
  this_00 = (DualMap *)operator_new(0x60);
  DualMap::DualMap(this_00);
  local_18 = this_00;
  std::
  vector<std::unique_ptr<bloaty::DualMap,std::default_delete<bloaty::DualMap>>,std::allocator<std::unique_ptr<bloaty::DualMap,std::default_delete<bloaty::DualMap>>>>
  ::emplace_back<bloaty::DualMap*>
            ((vector<std::unique_ptr<bloaty::DualMap,std::default_delete<bloaty::DualMap>>,std::allocator<std::unique_ptr<bloaty::DualMap,std::default_delete<bloaty::DualMap>>>>
              *)this,&local_18);
  return (this->maps_).
         super__Vector_base<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>._M_t.
         super__Tuple_impl<0UL,_bloaty::DualMap_*,_std::default_delete<bloaty::DualMap>_>.
         super__Head_base<0UL,_bloaty::DualMap_*,_false>._M_head_impl;
}

Assistant:

DualMap* AppendMap() {
    maps_.emplace_back(new DualMap);
    return maps_.back().get();
  }